

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t
dispatch_read(exr_const_context_t ctxt,void *buf,uint64_t sz,uint64_t *offsetp,int64_t *nread,
             _INTERNAL_EXR_READ_MODE rmode)

{
  long lVar1;
  long *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long *in_R8;
  int in_R9D;
  exr_result_t rv;
  int64_t rval;
  exr_result_t local_44;
  exr_result_t local_4;
  
  if (in_R8 != (long *)0x0) {
    *in_R8 = -1;
  }
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RCX == (long *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"read requested with no output offset pointer");
  }
  else if (*(long *)(in_RDI + 0xa0) == 0) {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,7);
  }
  else {
    lVar1 = (**(code **)(in_RDI + 0xa0))
                      (in_RDI,*(undefined8 *)(in_RDI + 0x88),in_RSI,in_RDX,*in_RCX,
                       *(undefined8 *)(in_RDI + 0x48));
    if (in_R8 != (long *)0x0) {
      *in_R8 = lVar1;
    }
    if (0 < lVar1) {
      *in_RCX = lVar1 + *in_RCX;
    }
    if ((lVar1 == in_RDX) || ((in_R9D == 1 && (-1 < lVar1)))) {
      local_44 = 0;
    }
    else {
      local_44 = 10;
    }
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

static exr_result_t
dispatch_read (
    exr_const_context_t          ctxt,
    void*                        buf,
    uint64_t                     sz,
    uint64_t*                    offsetp,
    int64_t*                     nread,
    enum _INTERNAL_EXR_READ_MODE rmode)
{
    int64_t      rval = -1;
    exr_result_t rv   = EXR_ERR_UNKNOWN;

    if (nread) *nread = rval;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!offsetp)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "read requested with no output offset pointer");

    if (ctxt->read_fn)
        rval = ctxt->read_fn (
            ctxt, ctxt->user_data, buf, sz, *offsetp, ctxt->print_error);
    else
        return ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_READ);

    if (nread) *nread = rval;
    if (rval > 0) *offsetp += (uint64_t) rval;

    if (rval == (int64_t) sz || (rmode == EXR_ALLOW_SHORT_READ && rval >= 0))
        rv = EXR_ERR_SUCCESS;
    else
        rv = EXR_ERR_READ_IO;

    return rv;
}